

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
__thiscall ninx::parser::Parser::parse_statement(Parser *this)

{
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  long in_RSI;
  Text *local_170;
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  *local_150;
  Variable *local_138;
  undefined1 local_108 [8];
  __single_object element_3;
  undefined1 local_f8 [23];
  allocator local_e1;
  string local_e0 [32];
  undefined1 local_c0 [8];
  __single_object element_2;
  undefined1 local_b0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_a8;
  vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
  *pvStack_98;
  char limiter;
  Limiter *limiter_token;
  undefined1 local_88 [8];
  __single_object element_1;
  undefined1 local_78 [8];
  __single_object element;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  value;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  local_58;
  string name;
  Variable *variable_token;
  undefined1 local_28 [16];
  Token *token;
  Parser *this_local;
  
  this_local = this;
  local_28._8_8_ = TokenReader::get_token((TokenReader *)(in_RSI + 0x20));
  if ((Token *)local_28._8_8_ == (Token *)0x0) {
LAB_0014b6d9:
    std::
    unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>
    ::unique_ptr<std::default_delete<ninx::parser::element::Statement>,void>
              ((unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>
                *)this,(nullptr_t)0x0);
  }
  else {
    iVar3 = (*((Token *)local_28._8_8_)->_vptr_Token[2])();
    switch(iVar3) {
    case 0:
      if ((Token *)local_28._8_8_ == (Token *)0x0) {
        local_170 = (Text *)0x0;
      }
      else {
        local_170 = (Text *)__dynamic_cast(local_28._8_8_,&lexer::token::Token::typeinfo,
                                           &lexer::token::Text::typeinfo,0);
      }
      lexer::token::Text::get_text_abi_cxx11_(local_170);
      std::make_unique<ninx::parser::element::TextElement,std::__cxx11::string_const&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
      std::
      unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>
      ::
      unique_ptr<ninx::parser::element::TextElement,std::default_delete<ninx::parser::element::TextElement>,void>
                ((unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>
                  *)this,(unique_ptr<ninx::parser::element::TextElement,_std::default_delete<ninx::parser::element::TextElement>_>
                          *)local_108);
      element_1._M_t.
      super___uniq_ptr_impl<ninx::parser::element::VariableRead,_std::default_delete<ninx::parser::element::VariableRead>_>
      ._M_t.
      super__Tuple_impl<0UL,_ninx::parser::element::VariableRead_*,_std::default_delete<ninx::parser::element::VariableRead>_>
      .super__Head_base<0UL,_ninx::parser::element::VariableRead_*,_false>._M_head_impl._4_4_ = 1;
      std::
      unique_ptr<ninx::parser::element::TextElement,_std::default_delete<ninx::parser::element::TextElement>_>
      ::~unique_ptr((unique_ptr<ninx::parser::element::TextElement,_std::default_delete<ninx::parser::element::TextElement>_>
                     *)local_108);
      break;
    case 1:
      if ((Token *)local_28._8_8_ == (Token *)0x0) {
        local_150 = (vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
                     *)0x0;
      }
      else {
        local_150 = (vector<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
                     *)__dynamic_cast(local_28._8_8_,&lexer::token::Token::typeinfo,
                                      &lexer::token::Limiter::typeinfo,0);
      }
      pvStack_98 = local_150;
      local_a8._M_local_buf[0xf] = lexer::token::Limiter::get_limiter((Limiter *)local_150);
      local_a8._M_allocated_capacity =
           (size_type)
           std::
           unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(in_RSI + 0x30),local_a8._M_local_buf + 0xf);
      local_b0 = (undefined1  [8])
                 std::
                 unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end((unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)(in_RSI + 0x30));
      bVar2 = std::__detail::operator!=
                        ((_Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                          *)(local_b0 + 8),
                         (_Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                          *)local_b0);
      uVar1 = local_a8._M_local_buf[0xf];
      if (bVar2) {
        TokenReader::seek_previous((TokenReader *)(in_RSI + 0x20));
        parse_operator_call((Parser *)&element_2,(char)in_RSI);
        std::
        unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>
        ::
        unique_ptr<ninx::parser::element::FunctionCall,std::default_delete<ninx::parser::element::FunctionCall>,void>
                  ((unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>
                    *)this,(unique_ptr<ninx::parser::element::FunctionCall,_std::default_delete<ninx::parser::element::FunctionCall>_>
                            *)&element_2);
        std::
        unique_ptr<ninx::parser::element::FunctionCall,_std::default_delete<ninx::parser::element::FunctionCall>_>
        ::~unique_ptr((unique_ptr<ninx::parser::element::FunctionCall,_std::default_delete<ninx::parser::element::FunctionCall>_>
                       *)&element_2);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_e0,1,uVar1,&local_e1);
        std::make_unique<ninx::parser::element::TextElement,std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
        std::__cxx11::string::~string(local_e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_e1);
        std::
        unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>
        ::
        unique_ptr<ninx::parser::element::TextElement,std::default_delete<ninx::parser::element::TextElement>,void>
                  ((unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>
                    *)this,(unique_ptr<ninx::parser::element::TextElement,_std::default_delete<ninx::parser::element::TextElement>_>
                            *)local_c0);
        element_1._M_t.
        super___uniq_ptr_impl<ninx::parser::element::VariableRead,_std::default_delete<ninx::parser::element::VariableRead>_>
        ._M_t.
        super__Tuple_impl<0UL,_ninx::parser::element::VariableRead_*,_std::default_delete<ninx::parser::element::VariableRead>_>
        .super__Head_base<0UL,_ninx::parser::element::VariableRead_*,_false>._M_head_impl._4_4_ = 1;
        std::
        unique_ptr<ninx::parser::element::TextElement,_std::default_delete<ninx::parser::element::TextElement>_>
        ::~unique_ptr((unique_ptr<ninx::parser::element::TextElement,_std::default_delete<ninx::parser::element::TextElement>_>
                       *)local_c0);
      }
      break;
    default:
      goto LAB_0014b6d9;
    case 3:
      if ((Token *)local_28._8_8_ == (Token *)0x0) {
        local_138 = (Variable *)0x0;
      }
      else {
        local_138 = (Variable *)
                    __dynamic_cast(local_28._8_8_,&lexer::token::Token::typeinfo,
                                   &lexer::token::Variable::typeinfo,0);
      }
      name.field_2._8_8_ = local_138;
      psVar4 = lexer::token::Variable::get_name_abi_cxx11_(local_138);
      std::__cxx11::string::string((string *)&local_58,(string *)psVar4);
      iVar3 = TokenReader::check_limiter((TokenReader *)(in_RSI + 0x20),'=');
      if (iVar3 == 1) {
        TokenReader::get_token((TokenReader *)(in_RSI + 0x20));
        parse_expression((Parser *)&element);
        std::
        make_unique<ninx::parser::element::Assignment,std::__cxx11::string&,std::unique_ptr<ninx::parser::element::Expression,std::default_delete<ninx::parser::element::Expression>>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                   &local_58);
        std::
        unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>
        ::
        unique_ptr<ninx::parser::element::Assignment,std::default_delete<ninx::parser::element::Assignment>,void>
                  ((unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>
                    *)this,(unique_ptr<ninx::parser::element::Assignment,_std::default_delete<ninx::parser::element::Assignment>_>
                            *)local_78);
        element_1._M_t.
        super___uniq_ptr_impl<ninx::parser::element::VariableRead,_std::default_delete<ninx::parser::element::VariableRead>_>
        ._M_t.
        super__Tuple_impl<0UL,_ninx::parser::element::VariableRead_*,_std::default_delete<ninx::parser::element::VariableRead>_>
        .super__Head_base<0UL,_ninx::parser::element::VariableRead_*,_false>._M_head_impl._4_4_ = 1;
        std::
        unique_ptr<ninx::parser::element::Assignment,_std::default_delete<ninx::parser::element::Assignment>_>
        ::~unique_ptr((unique_ptr<ninx::parser::element::Assignment,_std::default_delete<ninx::parser::element::Assignment>_>
                       *)local_78);
        std::
        unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
        ::~unique_ptr((unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                       *)&element);
      }
      else {
        limiter_token._4_4_ =
             lexer::token::Variable::get_trailing_spaces((Variable *)name.field_2._8_8_);
        std::make_unique<ninx::parser::element::VariableRead,std::__cxx11::string&,int>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   (int *)&local_58);
        std::
        unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>
        ::
        unique_ptr<ninx::parser::element::VariableRead,std::default_delete<ninx::parser::element::VariableRead>,void>
                  ((unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>
                    *)this,(unique_ptr<ninx::parser::element::VariableRead,_std::default_delete<ninx::parser::element::VariableRead>_>
                            *)local_88);
        element_1._M_t.
        super___uniq_ptr_impl<ninx::parser::element::VariableRead,_std::default_delete<ninx::parser::element::VariableRead>_>
        ._M_t.
        super__Tuple_impl<0UL,_ninx::parser::element::VariableRead_*,_std::default_delete<ninx::parser::element::VariableRead>_>
        .super__Head_base<0UL,_ninx::parser::element::VariableRead_*,_false>._M_head_impl._4_4_ = 1;
        std::
        unique_ptr<ninx::parser::element::VariableRead,_std::default_delete<ninx::parser::element::VariableRead>_>
        ::~unique_ptr((unique_ptr<ninx::parser::element::VariableRead,_std::default_delete<ninx::parser::element::VariableRead>_>
                       *)local_88);
      }
      std::__cxx11::string::~string((string *)&local_58);
      break;
    case 4:
      TokenReader::seek_previous((TokenReader *)(in_RSI + 0x20));
      parse_function_call((Parser *)(local_f8 + 8));
      std::
      unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>
      ::
      unique_ptr<ninx::parser::element::FunctionCall,std::default_delete<ninx::parser::element::FunctionCall>,void>
                ((unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>
                  *)this,(unique_ptr<ninx::parser::element::FunctionCall,_std::default_delete<ninx::parser::element::FunctionCall>_>
                          *)(local_f8 + 8));
      std::
      unique_ptr<ninx::parser::element::FunctionCall,_std::default_delete<ninx::parser::element::FunctionCall>_>
      ::~unique_ptr((unique_ptr<ninx::parser::element::FunctionCall,_std::default_delete<ninx::parser::element::FunctionCall>_>
                     *)(local_f8 + 8));
      break;
    case 5:
      parse_function_definition((Parser *)local_28);
      std::
      unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>
      ::
      unique_ptr<ninx::parser::element::FunctionDefinition,std::default_delete<ninx::parser::element::FunctionDefinition>,void>
                ((unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>
                  *)this,(unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
                          *)local_28);
      std::
      unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
      ::~unique_ptr((unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
                     *)local_28);
      break;
    case 6:
      parse_operator_definition((Parser *)&variable_token);
      std::
      unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>
      ::
      unique_ptr<ninx::parser::element::NoopStatement,std::default_delete<ninx::parser::element::NoopStatement>,void>
                ((unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>
                  *)this,(unique_ptr<ninx::parser::element::NoopStatement,_std::default_delete<ninx::parser::element::NoopStatement>_>
                          *)&variable_token);
      std::
      unique_ptr<ninx::parser::element::NoopStatement,_std::default_delete<ninx::parser::element::NoopStatement>_>
      ::~unique_ptr((unique_ptr<ninx::parser::element::NoopStatement,_std::default_delete<ninx::parser::element::NoopStatement>_>
                     *)&variable_token);
      break;
    case 7:
      TokenReader::seek_previous((TokenReader *)(in_RSI + 0x20));
      parse_if_statement((Parser *)local_f8);
      std::
      unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>
      ::
      unique_ptr<ninx::parser::element::IfStatement,std::default_delete<ninx::parser::element::IfStatement>,void>
                ((unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>
                  *)this,(unique_ptr<ninx::parser::element::IfStatement,_std::default_delete<ninx::parser::element::IfStatement>_>
                          *)local_f8);
      std::
      unique_ptr<ninx::parser::element::IfStatement,_std::default_delete<ninx::parser::element::IfStatement>_>
      ::~unique_ptr((unique_ptr<ninx::parser::element::IfStatement,_std::default_delete<ninx::parser::element::IfStatement>_>
                     *)local_f8);
      break;
    case 10:
      TokenReader::seek_previous((TokenReader *)(in_RSI + 0x20));
      parse_for_statement((Parser *)&element_3);
      std::
      unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>
      ::
      unique_ptr<ninx::parser::element::ForStatement,std::default_delete<ninx::parser::element::ForStatement>,void>
                ((unique_ptr<ninx::parser::element::Statement,std::default_delete<ninx::parser::element::Statement>>
                  *)this,(unique_ptr<ninx::parser::element::ForStatement,_std::default_delete<ninx::parser::element::ForStatement>_>
                          *)&element_3);
      std::
      unique_ptr<ninx::parser::element::ForStatement,_std::default_delete<ninx::parser::element::ForStatement>_>
      ::~unique_ptr((unique_ptr<ninx::parser::element::ForStatement,_std::default_delete<ninx::parser::element::ForStatement>_>
                     *)&element_3);
    }
  }
  return (__uniq_ptr_data<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Statement> ninx::parser::Parser::parse_statement() {
    Token *token{reader.get_token()};

    if (token) {
        switch (token->get_type()) {
            case Type::FUNCDEF: {
                return parse_function_definition();
            }
            case Type::OPDEF: {
                return parse_operator_definition();
            }
            case Type::VARIABLE: {
                auto variable_token {dynamic_cast<ninx::lexer::token::Variable *>(token)};
                // Get the variable name
                auto name{variable_token->get_name()};

                // Determine if the variable is used in an assignment by peeking the next
                // token and checking if it is a limiter equal to =
                if (reader.check_limiter('=') == 1) {  // Assignment
                    // Skip the = limiter
                    reader.get_token();

                    auto value = parse_expression();

                    auto element = std::make_unique<ninx::parser::element::Assignment>(name, std::move(value));
                    return element;
                } else {  // Variable used as value
                    auto element = std::make_unique<ninx::parser::element::VariableRead>(name, variable_token->get_trailing_spaces());
                    return element;
                }
            }
            case Type::LIMITER: {
                auto limiter_token { dynamic_cast<ninx::lexer::token::Limiter *>(token) };
                char limiter {limiter_token->get_limiter()};

                if (operators.find(limiter) != operators.end()) {  // Operator found, parse it
                    reader.seek_previous();
                    return parse_operator_call(limiter);
                }else{  // Limiter not registered, default to a text element
                    auto element = std::make_unique<TextElement>(std::string(1, limiter));
                    return element;
                }
            }
            case Type::FUNCNAME: {
                reader.seek_previous();  // Seek to the previous token to make the function able to read it again
                return parse_function_call();
            }
            case Type::IF: {
                reader.seek_previous();  // Rewind the if block
                return parse_if_statement();
            }
            case Type::FOR: {
                reader.seek_previous();  // Rewind the for block
                return parse_for_statement();
            }
            case Type::TEXT: {
                auto element = std::make_unique<TextElement>(
                        dynamic_cast<ninx::lexer::token::Text *>(token)->get_text());
                return element;
            }
        }

        // TODO: throw parse exception for unexpected token
    }

    // End of the document
    return nullptr;
}